

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

gvector gvector_dup(gvector_const v)

{
  gvector __dest;
  void *pvVar1;
  
  if (v != (gvector_const)0x0) {
    __dest = gvector_alloc(*(size_t *)((long)v + -0x18),*(size_t *)((long)v + -8),
                           *(size_t *)((long)v + -0x10));
    if (__dest != (gvector)0x0) {
      pvVar1 = memcpy(__dest,v,*(long *)((long)v + -0x10) * *(long *)((long)v + -8));
      return pvVar1;
    }
  }
  return (gvector)0x0;
}

Assistant:

gvector gvector_dup(gvector_const v)
{
  if (v)
  {
    gvector *w = gvector_alloc(gvector_cap(v), gvector_len(v), gvector_size(v));
    if (w)
    {
      memcpy(w, v, gvector_len(v) * gvector_size(v));
    }
    return w;
  }
  return NULL;
}